

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetCurrentFont(ImFont *font)

{
  ImGuiContext *pIVar1;
  ImFont *in_RDI;
  ImFontAtlas *atlas;
  ImGuiContext *g;
  float local_1c;
  
  pIVar1 = GImGui;
  GImGui->Font = in_RDI;
  pIVar1->FontBaseSize = (pIVar1->IO).FontGlobalScale * pIVar1->Font->FontSize * pIVar1->Font->Scale
  ;
  if (pIVar1->CurrentWindow == (ImGuiWindow *)0x0) {
    local_1c = 0.0;
  }
  else {
    local_1c = ImGuiWindow::CalcFontSize(pIVar1->CurrentWindow);
  }
  pIVar1->FontSize = local_1c;
  (pIVar1->DrawListSharedData).TexUvWhitePixel = pIVar1->Font->ContainerAtlas->TexUvWhitePixel;
  (pIVar1->DrawListSharedData).Font = pIVar1->Font;
  (pIVar1->DrawListSharedData).FontSize = pIVar1->FontSize;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale;
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}